

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

char * Dau_DsdPerform(word t)

{
  int iVar1;
  long lVar2;
  
  if (t == 0xffffffffffffffff) {
    Dau_DsdPerform::pBuffer[0] = '1';
  }
  else {
    if (t != 0) {
      iVar1 = Dau_DsdPerform_rec(t,Dau_DsdPerform::pBuffer,0,(int *)&DAT_008015c0,6);
      lVar2 = (long)iVar1;
      goto LAB_0042ef96;
    }
    Dau_DsdPerform::pBuffer[0] = '0';
  }
  lVar2 = 1;
LAB_0042ef96:
  Dau_DsdPerform::pBuffer[lVar2] = '\0';
  Dau_DsdComputeMatches(Dau_DsdPerform::pBuffer);
  Dau_DsdRemoveBraces(Dau_DsdPerform::pBuffer,Dau_DsdComputeMatches::pMatches);
  return Dau_DsdPerform::pBuffer;
}

Assistant:

char * Dau_DsdPerform( word t )
{
    static char pBuffer[DAU_MAX_STR];
    int pVarsNew[6] = {0, 1, 2, 3, 4, 5};
    int Pos = 0;
    if ( t == 0 )
        pBuffer[Pos++] = '0';
    else if ( t == ~(word)0 )
        pBuffer[Pos++] = '1';
    else
        Pos = Dau_DsdPerform_rec( t, pBuffer, Pos, pVarsNew, 6 );
    pBuffer[Pos++] = 0;
//    printf( "%d ", strlen(pBuffer) );
//    printf( "%s ->", pBuffer );
    Dau_DsdRemoveBraces( pBuffer, Dau_DsdComputeMatches(pBuffer) );
//    printf( " %s\n", pBuffer );
    return pBuffer;
}